

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retIncrem.c
# Opt level: O2

void Abc_NtkRetimeShareLatches(Abc_Ntk_t *pNtk,int fInitial)

{
  int iVar1;
  Vec_Ptr_t *p;
  Abc_Obj_t *pAVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  int i;
  Abc_Obj_t *pNodeTo;
  
  p = Vec_PtrAlloc(10);
  i = 0;
  do {
    if (pNtk->vObjs->nSize <= i) {
      Vec_PtrFree(p);
      return;
    }
    pAVar2 = Abc_NtkObj(pNtk,i);
    if ((pAVar2 != (Abc_Obj_t *)0x0) &&
       (iVar1 = Abc_NtkRetimeCheckCompatibleLatchFanouts(pAVar2), 1 < iVar1)) {
      uVar5 = (pAVar2->vFanouts).nSize;
      uVar3 = (ulong)uVar5;
      if ((int)uVar5 < 1) {
        uVar3 = 0;
      }
      uVar4 = 0;
      pNodeTo = (Abc_Obj_t *)0x0;
      do {
        if (uVar3 == uVar4) {
          if (pNodeTo == (Abc_Obj_t *)0x0) goto LAB_004063f2;
          uVar5 = *(uint *)&pNodeTo->field_0x14;
          break;
        }
        pNodeTo = (Abc_Obj_t *)pAVar2->pNtk->vObjs->pArray[(pAVar2->vFanouts).pArray[uVar4]];
        uVar5 = *(uint *)&pNodeTo->field_0x14;
        uVar4 = uVar4 + 1;
      } while ((uVar5 & 0xf) != 8);
      if ((uVar5 & 0xf) != 8) {
LAB_004063f2:
        __assert_fail("pLatchTop && Abc_ObjIsLatch(pLatchTop)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/ret/retIncrem.c"
                      ,0x1c4,"void Abc_NtkRetimeShareLatches(Abc_Ntk_t *, int)");
      }
      Abc_NodeCollectFanouts(pAVar2,p);
      for (iVar1 = 0; iVar1 < p->nSize; iVar1 = iVar1 + 1) {
        pAVar2 = (Abc_Obj_t *)Vec_PtrEntry(p,iVar1);
        if (((pAVar2 != pNodeTo) && ((*(uint *)&pAVar2->field_0x14 & 0xf) == 8)) &&
           ((pAVar2->field_5).pData == (pNodeTo->field_5).pData)) {
          if (fInitial != 0) {
            Abc_ObjAddFanin((pAVar2->field_6).pCopy,(pNodeTo->field_6).pCopy);
          }
          Abc_ObjTransferFanout(pAVar2,pNodeTo);
          Abc_NtkDeleteObj(pAVar2);
        }
      }
    }
    i = i + 1;
  } while( true );
}

Assistant:

void Abc_NtkRetimeShareLatches( Abc_Ntk_t * pNtk, int fInitial )
{
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pFanin, * pLatchTop, * pLatchCur;
    int i, k;
    vNodes = Vec_PtrAlloc( 10 );
    // consider latch fanins
    Abc_NtkForEachObj( pNtk, pFanin, i )
    {
        if ( Abc_NtkRetimeCheckCompatibleLatchFanouts(pFanin) <= 1 )
            continue;
        // get the first latch
        pLatchTop = NULL;
        Abc_ObjForEachFanout( pFanin, pLatchTop, k )
            if ( Abc_ObjIsLatch(pLatchTop) )
                break;
        assert( pLatchTop && Abc_ObjIsLatch(pLatchTop) );
        // redirect compatible fanout latches to the first latch
        Abc_NodeCollectFanouts( pFanin, vNodes );
        Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pLatchCur, k )
        {
            if ( !Abc_ObjIsLatch(pLatchCur) )
                continue;
            if ( pLatchCur == pLatchTop )
                continue;
            if ( pLatchCur->pData != pLatchTop->pData )
                continue;
            // connect the initial state
            if ( fInitial )
                Abc_ObjAddFanin( pLatchCur->pCopy, pLatchTop->pCopy );
            // redirect the fanouts
            Abc_ObjTransferFanout( pLatchCur, pLatchTop );
            Abc_NtkDeleteObj(pLatchCur);
        }
    }
    Vec_PtrFree( vNodes );
}